

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall summarycalc::reset_sse_array(summarycalc *this)

{
  int iVar1;
  int iVar2;
  OASIS_FLOAT *pOVar3;
  int i;
  long lVar4;
  long lVar5;
  
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    if (this->fout[lVar4] != (FILE *)0x0) {
      iVar1 = this->max_summary_id_[lVar4];
      iVar2 = this->min_summary_id_[lVar4];
      pOVar3 = this->sse[lVar4];
      for (lVar5 = 0; lVar5 <= (iVar1 - iVar2) + 1; lVar5 = lVar5 + 1) {
        pOVar3[lVar5] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void summarycalc::reset_sse_array()
{
	for (int i = 0; i < MAX_SUMMARY_SETS; i++) {
		if (fout[i] != nullptr) {
			OASIS_FLOAT *se = sse[i];		// f array of se[summary_id] to exposure
			int maxsummaryids = max_summary_id_[i] - min_summary_id_[i] + 1;
			for (int j = 0; j <= maxsummaryids; j++) {
				se[j] = 0;
			}
		}
	}
}